

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_polar_codes.cpp
# Opt level: O0

bool lzham::generate_polar_codes
               (void *pContext,uint num_syms,uint16 *pFreq,uint8 *pCodesizes,uint *max_code_size,
               uint *total_freq_ret)

{
  ushort uVar1;
  uint b;
  ushort *puVar2;
  long in_RCX;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  int *in_R9;
  sym_freq_conflict *syms;
  sym_freq_conflict *sf;
  uint freq;
  uint i;
  uint num_used_syms;
  uint total_freq;
  uint max_freq;
  polar_work_tables *state;
  uint *in_stack_00000948;
  uint8 *in_stack_00000950;
  sym_freq_conflict *in_stack_00000958;
  uint in_stack_00000964;
  sym_freq_conflict *in_stack_00000c30;
  sym_freq_conflict *in_stack_00000c38;
  uint in_stack_00000c44;
  uint local_50;
  uint local_4c;
  int local_48;
  uint local_44;
  bool local_1;
  
  if ((in_ESI == 0) || (600 < in_ESI)) {
    local_1 = false;
  }
  else {
    local_44 = 0;
    local_48 = 0;
    local_4c = 0;
    for (local_50 = 0; local_50 < in_ESI; local_50 = local_50 + 1) {
      uVar1 = *(ushort *)(in_RDX + (ulong)local_50 * 2);
      b = (uint)uVar1;
      if (b == 0) {
        *(undefined1 *)(in_RCX + (ulong)local_50) = 0;
      }
      else {
        local_48 = b + local_48;
        local_44 = math::maximum<unsigned_int>(local_44,b);
        puVar2 = (ushort *)(in_RDI + (ulong)local_4c * 4);
        puVar2[1] = (ushort)local_50;
        *puVar2 = uVar1;
        local_4c = local_4c + 1;
      }
    }
    *in_R9 = local_48;
    if (local_4c == 1) {
      *(undefined1 *)(in_RCX + (ulong)*(ushort *)(in_RDI + 2)) = 1;
    }
    else {
      radix_sort_syms(in_stack_00000c44,in_stack_00000c38,in_stack_00000c30);
      generate_polar_codes(in_stack_00000964,in_stack_00000958,in_stack_00000950,in_stack_00000948);
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool generate_polar_codes(void* pContext, uint num_syms, const uint16* pFreq, uint8* pCodesizes, uint& max_code_size, uint& total_freq_ret)
   {
      if ((!num_syms) || (num_syms > cPolarMaxSupportedSyms))
         return false;

      polar_work_tables& state = *static_cast<polar_work_tables*>(pContext);;

      uint max_freq = 0;
      uint total_freq = 0;

      uint num_used_syms = 0;
      for (uint i = 0; i < num_syms; i++)
      {
         uint freq = pFreq[i];

         if (!freq)
            pCodesizes[i] = 0;
         else
         {
            total_freq += freq;
            max_freq = math::maximum(max_freq, freq);

            sym_freq& sf = state.syms0[num_used_syms];
            sf.m_sym = static_cast<uint16>(i);
            sf.m_freq = static_cast<uint16>(freq);
            num_used_syms++;
         }            
      }

      total_freq_ret = total_freq;

      if (num_used_syms == 1)
      {
         pCodesizes[state.syms0[0].m_sym] = 1;
      }
      else
      {
         sym_freq* syms = radix_sort_syms(num_used_syms, state.syms0, state.syms1);
         
#if LZHAM_USE_SHANNON_FANO_CODES
         generate_shannon_fano_codes(num_syms, syms, total_freq, pCodesizes, max_code_size);
#elif LZHAM_USE_FYFFE_CODES         
         generate_fyffe_codes(num_syms, syms, pCodesizes, max_code_size);
#else
         generate_polar_codes(num_syms, syms, pCodesizes, max_code_size);
#endif         
      }

      return true;
   }